

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

QModelIndex * __thiscall
QtPrivate::QCalendarView::moveCursor
          (QModelIndex *__return_storage_ptr__,QCalendarView *this,CursorAction cursorAction,
          KeyboardModifiers modifiers)

{
  undefined8 uVar1;
  QAbstractItemModel *object;
  QCalendarModel *pQVar2;
  ulong uVar3;
  int extraout_var;
  long in_FS_OFFSET;
  undefined8 uStack_80;
  QDate local_60;
  undefined8 local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  undefined1 local_38 [16];
  
  local_38._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  object = QAbstractItemView::model((QAbstractItemView *)this);
  pQVar2 = qobject_cast_helper<QtPrivate::QCalendarModel*,QObject>((QObject *)object);
  if (pQVar2 == (QCalendarModel *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38._8_8_) {
      QTableView::moveCursor(__return_storage_ptr__,&this->super_QTableView,cursorAction,modifiers);
      return __return_storage_ptr__;
    }
    goto LAB_003a538c;
  }
  uVar1 = *(undefined8 *)&pQVar2->m_calendar;
  local_38._0_8_ = uVar1;
  if (this->readOnly == true) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38._8_8_) {
      QAbstractItemView::currentIndex(__return_storage_ptr__,(QAbstractItemView *)this);
      return __return_storage_ptr__;
    }
    goto LAB_003a538c;
  }
  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QModelIndex *)&local_58,(QAbstractItemView *)this);
  pQVar2 = (QCalendarModel *)QAbstractItemView::model((QAbstractItemView *)this);
  local_60 = QCalendarModel::dateForCell(pQVar2,(int)local_58,local_58._4_4_);
  switch(cursorAction) {
  case MoveUp:
    goto LAB_003a52e6;
  case MoveDown:
    goto LAB_003a52e6;
  case MoveLeft:
    QWidget::isRightToLeft((QWidget *)this);
    goto LAB_003a52e6;
  case MoveRight:
    QWidget::isRightToLeft((QWidget *)this);
LAB_003a52e6:
    local_60.jd = QDate::addDays((longlong)&local_60);
    break;
  case MoveHome:
    QCalendar::partsFromDate((QDate)local_38);
    if (extraout_var != -0x80000000) {
LAB_003a532e:
      local_60.jd = QCalendar::dateFromParts((YearMonthDay *)local_38);
    }
    break;
  case MoveEnd:
    uVar3 = QCalendar::partsFromDate((QDate)local_38);
    if (uVar3 >> 0x20 != 0x80000000) {
      QCalendar::daysInMonth((int)local_38,(int)(uVar3 >> 0x20));
      goto LAB_003a532e;
    }
    break;
  case MovePageUp:
    uStack_80 = 0xffffffffffffffff;
    goto LAB_003a5341;
  case MovePageDown:
    uStack_80 = 1;
LAB_003a5341:
    local_60.jd = QDate::addMonths(&local_60,uStack_80,uVar1);
    break;
  case MoveNext:
  case MovePrevious:
    goto switchD_003a524d_caseD_8;
  }
  changeDate(this,local_60,true);
switchD_003a524d_caseD_8:
  QAbstractItemView::currentIndex(__return_storage_ptr__,(QAbstractItemView *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38._8_8_) {
    return __return_storage_ptr__;
  }
LAB_003a538c:
  __stack_chk_fail();
}

Assistant:

QModelIndex QCalendarView::moveCursor(CursorAction cursorAction, Qt::KeyboardModifiers modifiers)
{
    QCalendarModel *calendarModel = qobject_cast<QCalendarModel *>(model());
    if (!calendarModel)
        return QTableView::moveCursor(cursorAction, modifiers);

    QCalendar cal = calendarModel->calendar();

    if (readOnly)
        return currentIndex();

    QModelIndex index = currentIndex();
    QDate currentDate = static_cast<QCalendarModel*>(model())->dateForCell(index.row(), index.column());
    switch (cursorAction) {
        case QAbstractItemView::MoveUp:
            currentDate = currentDate.addDays(-7);
            break;
        case QAbstractItemView::MoveDown:
            currentDate = currentDate.addDays(7);
            break;
        case QAbstractItemView::MoveLeft:
            currentDate = currentDate.addDays(isRightToLeft() ? 1 : -1);
            break;
        case QAbstractItemView::MoveRight:
            currentDate = currentDate.addDays(isRightToLeft() ? -1 : 1);
            break;
        case QAbstractItemView::MoveHome: {
            auto parts = cal.partsFromDate(currentDate);
            if (parts.isValid()) {
                parts.day = 1;
                currentDate = cal.dateFromParts(parts);
            }
        }
            break;
        case QAbstractItemView::MoveEnd: {
            auto parts = cal.partsFromDate(currentDate);
            if (parts.isValid()) {
                parts.day = cal.daysInMonth(parts.month, parts.year);
                currentDate = cal.dateFromParts(parts);
            }
        }
            break;
        case QAbstractItemView::MovePageUp:
            currentDate = currentDate.addMonths(-1, cal);
            break;
        case QAbstractItemView::MovePageDown:
            currentDate = currentDate.addMonths(1, cal);
            break;
        case QAbstractItemView::MoveNext:
        case QAbstractItemView::MovePrevious:
            return currentIndex();
        default:
            break;
    }
    emit changeDate(currentDate, true);
    return currentIndex();
}